

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void loop_through_half_edges_inside_a_face(Mesh *new_mesh)

{
  Face *input_face;
  reference ppFVar1;
  ostream *poVar2;
  HalfEdge *pHVar3;
  uint uVar4;
  long lVar5;
  _Vector_base<HalfMesh::Face_*,_std::allocator<HalfMesh::Face_*>_> local_48;
  
  uVar4 = 0;
  while( true ) {
    std::vector<HalfMesh::Face_*,_std::allocator<HalfMesh::Face_*>_>::vector
              ((vector<HalfMesh::Face_*,_std::allocator<HalfMesh::Face_*>_> *)&local_48,
               &new_mesh->all_faces);
    lVar5 = (long)local_48._M_impl.super__Vector_impl_data._M_finish -
            (long)local_48._M_impl.super__Vector_impl_data._M_start;
    std::_Vector_base<HalfMesh::Face_*,_std::allocator<HalfMesh::Face_*>_>::~_Vector_base(&local_48)
    ;
    if ((ulong)(lVar5 >> 3) <= (ulong)uVar4) break;
    std::vector<HalfMesh::Face_*,_std::allocator<HalfMesh::Face_*>_>::vector
              ((vector<HalfMesh::Face_*,_std::allocator<HalfMesh::Face_*>_> *)&local_48,
               &new_mesh->all_faces);
    ppFVar1 = std::vector<HalfMesh::Face_*,_std::allocator<HalfMesh::Face_*>_>::at
                        ((vector<HalfMesh::Face_*,_std::allocator<HalfMesh::Face_*>_> *)&local_48,
                         (ulong)uVar4);
    input_face = *ppFVar1;
    std::_Vector_base<HalfMesh::Face_*,_std::allocator<HalfMesh::Face_*>_>::~_Vector_base(&local_48)
    ;
    poVar2 = std::operator<<((ostream *)&std::cout,"One half edge for face F: ");
    poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
    poVar2 = std::operator<<(poVar2," HE : ");
    poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
    std::endl<char,std::char_traits<char>>(poVar2);
    pHVar3 = HalfMesh::Mesh::get_half_edge(new_mesh,input_face->one_half_edge->half_edge_handle);
    pHVar3 = HalfMesh::Mesh::get_next_half_edge(new_mesh,pHVar3,input_face);
    pHVar3 = HalfMesh::Mesh::get_half_edge(new_mesh,pHVar3->half_edge_handle);
    pHVar3 = HalfMesh::Mesh::get_next_half_edge(new_mesh,pHVar3,input_face);
    pHVar3 = HalfMesh::Mesh::get_half_edge(new_mesh,pHVar3->half_edge_handle);
    HalfMesh::Mesh::get_next_half_edge(new_mesh,pHVar3,input_face);
    poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
    poVar2 = std::operator<<(poVar2,"->");
    poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
    poVar2 = std::operator<<(poVar2,"->");
    poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
    poVar2 = std::operator<<(poVar2,"->");
    poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
    std::endl<char,std::char_traits<char>>(poVar2);
    uVar4 = uVar4 + 1;
  }
  return;
}

Assistant:

void loop_through_half_edges_inside_a_face(HalfMesh::Mesh *new_mesh) {
    for (unsigned int i = 0; i < new_mesh->get_faces().size(); ++i) {
        HalfMesh::Face *new_face = new_mesh->get_faces().at(i);
        std::cout << "One half edge for face F: " << new_face->handle() << " HE : "
                  << new_face->get_one_half_edge()->handle() << std::endl;
        unsigned int he_1, he_2, he_3, he_4;
        he_1 = new_face->get_one_half_edge()->handle();
        he_2 = new_mesh->get_next_half_edge(new_mesh->get_half_edge(he_1), new_face)->handle();
        he_3 = new_mesh->get_next_half_edge(new_mesh->get_half_edge(he_2), new_face)->handle();
        he_4 = new_mesh->get_next_half_edge(new_mesh->get_half_edge(he_3), new_face)->handle();
        std::cout << he_1 << "->" << he_2 << "->" << he_3 << "->" << he_4 << std::endl;
    }
}